

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O3

void __thiscall cinatra::coro_http_client::reset(coro_http_client *this)

{
  streambuf *psVar1;
  ulong uVar2;
  element_type *peVar3;
  id *owner;
  error_code eVar4;
  error_code ec;
  type_info *local_88;
  id *local_80;
  undefined1 local_78 [24];
  protocol_type local_60;
  id *local_58 [3];
  undefined **local_40;
  id **local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  
  if (((((this->socket_).
         super___shared_ptr<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
       ->has_closed_)._M_base._M_i & 1U) == 0) {
    close_socket((this->socket_).
                 super___shared_ptr<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
  }
  owner = (id *)((this->executor_wrapper_).executor_.target_ & 0xfffffffffffffffc);
  local_88 = (type_info *)
             &asio::detail::typeid_wrapper<asio::detail::reactive_socket_service<asio::ip::tcp>>::
              typeinfo;
  local_80 = (id *)0x0;
  local_78._0_8_ =
       asio::detail::service_registry::do_use_service
                 (*(service_registry **)owner,(key *)&local_88,
                  asio::detail::service_registry::
                  create<asio::detail::reactive_socket_service<asio::ip::tcp>,asio::io_context>,
                  owner);
  local_38 = local_58;
  local_60.family_ = 2;
  local_30 = asio::execution::detail::any_executor_base::
             target_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>(bool,std::enable_if<!is_same<asio::io_context::basic_executor_type<std::allocator<void>,0ul>,void>::value,void>::type*)
             ::fns_with_execute;
  local_40 = &asio::execution::detail::any_executor_base::
              object_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>(std::enable_if<(!is_same<asio::io_context::basic_executor_type<std::allocator<void>,0ul>,void>::value)&&(!is_same<asio::io_context::basic_executor_type<std::allocator<void>,0ul>,std::shared_ptr<void>>::value),void>::type*)
              ::fns;
  local_28 = asio::execution::
             any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>
             ::prop_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>()::
             fns;
  local_78._8_4_ = -1;
  local_78[0xc] = '\0';
  local_78._16_8_ = (per_descriptor_data)0x0;
  local_58[0] = owner;
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  operator=((io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
             *)(this->socket_).
               super___shared_ptr<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,
            (io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
             *)local_78);
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  ~io_object_impl((io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
                   *)local_78);
  peVar3 = (this->socket_).
           super___shared_ptr<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if ((peVar3->impl_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.implementation_
      .super_base_implementation_type.socket_ == -1) {
    local_88 = (type_info *)((ulong)local_88 & 0xffffffff00000000);
    local_80 = (id *)std::_V2::system_category();
    eVar4 = asio::detail::reactive_socket_service_base::do_open
                      (&((peVar3->impl_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.
                         impl_.service_)->super_reactive_socket_service_base,
                       &(peVar3->impl_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.
                        impl_.implementation_.super_base_implementation_type,2,1,6,
                       (error_code *)&local_88);
    if (eVar4._M_value == 0) {
      (peVar3->impl_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.implementation_
      .protocol_.family_ = 2;
    }
    if ((int)local_88 != 0) {
      (**(code **)(*(long *)local_80 + 0x20))(local_78);
      if ((service_type *)local_78._0_8_ == (service_type *)(local_78 + 0x10)) {
        return;
      }
      operator_delete((void *)local_78._0_8_,
                      (ulong)((long)&((operation *)local_78._16_8_)->next_ + 1));
      return;
    }
    peVar3 = (this->socket_).
             super___shared_ptr<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
  }
  LOCK();
  (peVar3->has_closed_)._M_base._M_i = true;
  UNLOCK();
  psVar1 = this->head_buf_;
  uVar2 = *(ulong *)&psVar1->field_0x28;
  if (*(ulong *)&psVar1->field_0x18 < uVar2) {
    *(pointer *)&psVar1->field_0x8 =
         (psVar1->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start;
    *(ulong *)&psVar1->field_0x18 = uVar2;
  }
  *(long *)&psVar1->field_0x10 =
       *(long *)&psVar1->field_0x10 + (long)((int)uVar2 - (int)*(long *)&psVar1->field_0x10);
  psVar1 = this->chunked_buf_;
  uVar2 = *(ulong *)&psVar1->field_0x28;
  if (*(ulong *)&psVar1->field_0x18 < uVar2) {
    *(pointer *)&psVar1->field_0x8 =
         (psVar1->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start;
    *(ulong *)&psVar1->field_0x18 = uVar2;
  }
  *(long *)&psVar1->field_0x10 =
       *(long *)&psVar1->field_0x10 + (long)((int)uVar2 - (int)*(long *)&psVar1->field_0x10);
  (this->resp_chunk_str_)._M_string_length = 0;
  *(this->resp_chunk_str_)._M_dataplus._M_p = '\0';
  return;
}

Assistant:

void reset() {
    if (!has_closed()) {
      close_socket(*socket_);
    }

    socket_->impl_ = asio::ip::tcp::socket{executor_wrapper_.context()};
    if (!socket_->impl_.is_open()) {
      std::error_code ec;
      socket_->impl_.open(asio::ip::tcp::v4(), ec);
      if (ec) {
        CINATRA_LOG_WARNING << "client reset socket failed, reason: "
                            << ec.message();
        return;
      }
    }

    socket_->has_closed_ = true;
#ifdef CINATRA_ENABLE_SSL
    need_set_sni_host_ = true;
    if (has_init_ssl_) {
      socket_->ssl_stream_ = nullptr;
      socket_->ssl_stream_ =
          std::make_unique<asio::ssl::stream<asio::ip::tcp::socket &>>(
              socket_->impl_, *ssl_ctx_);
      has_init_ssl_ = false;
    }
#endif
#ifdef BENCHMARK_TEST
    total_len_ = 0;
#endif

    // clear
    head_buf_.consume(head_buf_.size());
    chunked_buf_.consume(chunked_buf_.size());
    resp_chunk_str_.clear();
  }